

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O1

OptionBase<Kernel::PolyNf::SubtermIter> * __thiscall
Lib::OptionBase<Kernel::PolyNf::SubtermIter>::operator=
          (OptionBase<Kernel::PolyNf::SubtermIter> *this,
          OptionBase<Kernel::PolyNf::SubtermIter> *other)

{
  undefined8 *puVar1;
  size_t sVar2;
  BottomUpChildIter<Kernel::PolyNf> *pBVar3;
  BottomUpChildIter<Kernel::PolyNf> *pBVar4;
  BottomUpChildIter<Kernel::PolyNf> *pBVar5;
  void **head_6;
  ulong uVar6;
  
  if ((this->_isSome == true) &&
     (puVar1 = *(undefined8 **)((long)&(this->_elem)._elem + 8), puVar1 != (undefined8 *)0x0)) {
    uVar6 = (this->_elem)._elem.init._stack._capacity * 0x24 + 0xf & 0xfffffffffffffff0;
    if (uVar6 == 0) {
      *puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puVar1;
    }
    else if (uVar6 < 0x11) {
      *puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = puVar1;
    }
    else if (uVar6 < 0x19) {
      *puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = puVar1;
    }
    else if (uVar6 < 0x21) {
      *puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = puVar1;
    }
    else if (uVar6 < 0x31) {
      *puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = puVar1;
    }
    else if (uVar6 < 0x41) {
      *puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = puVar1;
    }
    else {
      operator_delete(puVar1,0x10);
    }
  }
  if (other->_isSome == true) {
    sVar2 = (other->_elem)._elem.init._stack._capacity;
    (other->_elem)._elem.init._stack._capacity = 0;
    pBVar3 = (other->_elem)._elem.init._stack._end;
    (other->_elem)._elem.init._stack._end = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
    pBVar4 = (other->_elem)._elem.init._stack._stack;
    pBVar5 = (other->_elem)._elem.init._stack._cursor;
    (other->_elem)._elem.init._stack._stack = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
    (other->_elem)._elem.init._stack._cursor = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
    (this->_elem)._elem.init._stack._capacity = 0;
    (this->_elem)._elem.init._stack._stack = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
    (this->_elem)._elem.init._stack._cursor = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
    (this->_elem)._elem.init._stack._end = (BottomUpChildIter<Kernel::PolyNf> *)0x0;
    (this->_elem)._elem.init._stack._capacity = sVar2;
    (this->_elem)._elem.init._stack._end = pBVar3;
    puVar1 = *(undefined8 **)((long)&(this->_elem)._elem + 8);
    (this->_elem)._elem.init._stack._stack = pBVar4;
    (this->_elem)._elem.init._stack._cursor = pBVar5;
    if (puVar1 != (undefined8 *)0x0) {
      *puVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puVar1;
    }
  }
  this->_isSome = other->_isSome;
  return this;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }